

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_file_control(sqlite3 *db,char *zDbName,int op,void *pArg)

{
  Btree *p;
  Pager *pPager_00;
  sqlite3_file *id;
  sqlite3_file *fd;
  Pager *pPager;
  Btree *pBtree;
  int rc;
  void *pArg_local;
  int op_local;
  char *zDbName_local;
  sqlite3 *db_local;
  
  pBtree._4_4_ = 1;
  sqlite3_mutex_enter(db->mutex);
  p = sqlite3DbNameToBtree(db,zDbName);
  if (p != (Btree *)0x0) {
    sqlite3BtreeEnter(p);
    pPager_00 = sqlite3BtreePager(p);
    id = sqlite3PagerFile(pPager_00);
    if (op == 7) {
      *(sqlite3_file **)pArg = id;
      pBtree._4_4_ = 0;
    }
    else if (id->pMethods == (sqlite3_io_methods *)0x0) {
      pBtree._4_4_ = 0xc;
    }
    else {
      pBtree._4_4_ = sqlite3OsFileControl(id,op,pArg);
    }
    sqlite3BtreeLeave(p);
  }
  sqlite3_mutex_leave(db->mutex);
  return pBtree._4_4_;
}

Assistant:

SQLITE_API int sqlite3_file_control(sqlite3 *db, const char *zDbName, int op, void *pArg){
  int rc = SQLITE_ERROR;
  Btree *pBtree;

  sqlite3_mutex_enter(db->mutex);
  pBtree = sqlite3DbNameToBtree(db, zDbName);
  if( pBtree ){
    Pager *pPager;
    sqlite3_file *fd;
    sqlite3BtreeEnter(pBtree);
    pPager = sqlite3BtreePager(pBtree);
    assert( pPager!=0 );
    fd = sqlite3PagerFile(pPager);
    assert( fd!=0 );
    if( op==SQLITE_FCNTL_FILE_POINTER ){
      *(sqlite3_file**)pArg = fd;
      rc = SQLITE_OK;
    }else if( fd->pMethods ){
      rc = sqlite3OsFileControl(fd, op, pArg);
    }else{
      rc = SQLITE_NOTFOUND;
    }
    sqlite3BtreeLeave(pBtree);
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;   
}